

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerImpl::CommandMigrate
          (CommissionerImpl *this,ErrorHandler *aHandler,string *aDstAddr,string *aDstNetworkName)

{
  type tVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  undefined8 uVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar6;
  bool bVar7;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view fmt;
  Error error;
  Address dstAddr;
  anon_class_32_1_d0c21527 onResponse;
  writer write;
  Request request;
  undefined1 local_1f8 [8];
  uchar *local_1f0;
  char local_1e8 [8];
  uchar local_1e0 [16];
  type local_1d0;
  undefined1 *local_1c8;
  long local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [8];
  _Alloc_hider local_1a0;
  undefined1 local_198 [24];
  parse_func local_180;
  code *local_178;
  string local_168;
  Address local_148;
  _Any_data local_128;
  code *local_118;
  _Any_data local_108;
  code *local_f8;
  undefined1 local_e8 [8];
  _Alloc_hider local_e0;
  char local_d0 [16];
  writer local_c0;
  Message local_b8;
  
  local_1c8 = local_1b8;
  local_1d0 = 0;
  local_1c0 = 0;
  local_1b8[0] = 0;
  local_148.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  coap::Message::Message(&local_b8,kConfirmable,kPost);
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_108,aHandler);
  iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[9])(this);
  if ((char)iVar3 == '\0') {
    local_1a8 = (undefined1  [8])((ulong)local_1a8 & 0xffffffff00000000);
    local_1a0._M_p = "the commissioner is not active";
    local_198._0_8_ = 0x1e;
    local_198._8_8_ = 0;
    local_180 = (parse_func)0x0;
    pcVar6 = "the commissioner is not active";
    local_198._16_8_ =
         (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_1a8;
    do {
      pcVar4 = pcVar6 + 1;
      if (*pcVar6 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar6 + 2;
      }
      else if (*pcVar6 == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",(format_string_checker<char> *)local_1a8);
      }
      pcVar6 = pcVar4;
    } while (pcVar4 != "");
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_1a8;
    ::fmt::v10::vformat_abi_cxx11_(&local_168,(v10 *)0x2193cb,(string_view)ZEXT816(0x1e),args_00);
    local_1f8._0_4_ = 0xf;
    local_1f0 = local_1e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f0,local_168._M_dataplus._M_p,
               local_168._M_dataplus._M_p + local_168._M_string_length);
LAB_0016480a:
    local_1d0 = local_1f8._0_4_;
    std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_1f0);
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p == &local_168.field_2) goto LAB_00164843;
  }
  else {
    iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
    if ((char)iVar3 == '\0') {
      local_1a8 = (undefined1  [8])((ulong)local_1a8 & 0xffffffff00000000);
      pcVar6 = "Migrating a Device is only valid in CCM Mode";
      local_1a0._M_p = "Migrating a Device is only valid in CCM Mode";
      local_198._0_8_ = 0x2c;
      local_198._8_8_ = 0;
      local_180 = (parse_func)0x0;
      local_198._16_8_ =
           (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_1a8;
      local_c0.handler_ = (format_string_checker<char> *)local_1a8;
      do {
        if (pcVar6 == "") break;
        pcVar4 = pcVar6;
        if (*pcVar6 == '{') {
LAB_00164782:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_c0,pcVar6,pcVar4);
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar4,"",(format_string_checker<char> *)local_1a8);
          bVar7 = true;
        }
        else {
          pcVar4 = pcVar6 + 1;
          bVar7 = pcVar4 != "";
          if (bVar7) {
            if (*pcVar4 != '{') {
              pcVar2 = pcVar6 + 2;
              do {
                pcVar4 = pcVar2;
                bVar7 = pcVar4 != "";
                if (pcVar4 == "") goto LAB_0016477e;
                pcVar2 = pcVar4 + 1;
              } while (*pcVar4 != '{');
            }
            bVar7 = true;
          }
LAB_0016477e:
          if (bVar7) goto LAB_00164782;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_c0,pcVar6,"");
          bVar7 = false;
        }
      } while (bVar7);
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)local_1a8;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_168,(v10 *)"Migrating a Device is only valid in CCM Mode",
                 (string_view)ZEXT816(0x2c),args_01);
      local_1f8._0_4_ = 0xf;
      local_1f0 = local_1e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f0,local_168._M_dataplus._M_p,
                 local_168._M_dataplus._M_p + local_168._M_string_length);
      goto LAB_0016480a;
    }
    Address::Set((Error *)local_1a8,&local_148,aDstAddr);
    local_1d0 = local_1a8._0_4_;
    std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_1a0);
    tVar1 = local_1d0;
    if (local_1a0._M_p != local_198 + 8) {
      operator_delete(local_1a0._M_p);
    }
    if (tVar1 != none_type) goto LAB_00164843;
    if (0x10 < aDstNetworkName->_M_string_length) {
      local_1a8._0_4_ = ulong_long_type;
      local_1a8._4_4_ = ulong_long_type;
      local_1a0._M_p = "Network Name length={} > {}";
      local_198._0_8_ = 0x1b;
      local_198._8_8_ = 0x200000000;
      local_180 = ::fmt::v10::detail::
                  parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
      local_178 = ::fmt::v10::detail::
                  parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
      pcVar6 = "Network Name length={} > {}";
      local_198._16_8_ =
           (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_1a8;
      do {
        pcVar4 = pcVar6 + 1;
        if (*pcVar6 == '}') {
          if ((pcVar4 == "") || (*pcVar4 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar4 = pcVar6 + 2;
        }
        else if (*pcVar6 == '{') {
          pcVar4 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_long,unsigned_long>&>
                             (pcVar6,"",
                              (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_1a8);
        }
        pcVar6 = pcVar4;
      } while (pcVar4 != "");
      local_1a8 = (undefined1  [8])aDstNetworkName->_M_string_length;
      local_198._0_8_ = 0x10;
      args_02.field_1.args_ = in_R9.args_;
      args_02.desc_ = (unsigned_long_long)local_1a8;
      fmt.size_ = 0x44;
      fmt.data_ = (char *)0x1b;
      ::fmt::v10::vformat_abi_cxx11_(&local_168,(v10 *)"Network Name length={} > {}",fmt,args_02);
      local_1f8._0_4_ = 2;
      local_1f0 = local_1e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f0,local_168._M_dataplus._M_p,
                 local_168._M_dataplus._M_p + local_168._M_string_length);
      goto LAB_0016480a;
    }
    local_1f8 = (undefined1  [8])local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"/c/nm","");
    coap::Message::SetUriPath((Error *)local_1a8,&local_b8,(string *)local_1f8);
    local_1d0 = local_1a8._0_4_;
    std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_1a0);
    tVar1 = local_1d0;
    if (local_1a0._M_p != local_198 + 8) {
      operator_delete(local_1a0._M_p);
    }
    if (local_1f8 != (undefined1  [8])local_1e8) {
      operator_delete((void *)local_1f8);
    }
    if (tVar1 != none_type) goto LAB_00164843;
    iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[7])(this);
    tlv::Tlv::Tlv((Tlv *)local_1f8,kCommissionerSessionId,(uint16_t)iVar3,kMeshCoP);
    AppendTlv((Error *)local_1a8,&local_b8,(Tlv *)local_1f8);
    local_1d0 = local_1a8._0_4_;
    std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_1a0);
    tVar1 = local_1d0;
    if (local_1a0._M_p != local_198 + 8) {
      operator_delete(local_1a0._M_p);
    }
    if (local_1f0 != (uchar *)0x0) {
      operator_delete(local_1f0);
    }
    if (tVar1 != none_type) goto LAB_00164843;
    tlv::Tlv::Tlv((Tlv *)local_1f8,kNetworkDiagTimeout,aDstNetworkName,kMeshCoP);
    AppendTlv((Error *)local_1a8,&local_b8,(Tlv *)local_1f8);
    local_1d0 = local_1a8._0_4_;
    std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_1a0);
    tVar1 = local_1d0;
    if (local_1a0._M_p != local_198 + 8) {
      operator_delete(local_1a0._M_p);
    }
    if (local_1f0 != (uchar *)0x0) {
      operator_delete(local_1f0);
    }
    if (tVar1 != none_type) goto LAB_00164843;
    iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
    if ((char)iVar3 != '\0') {
      SignRequest((Error *)local_1a8,this,&local_b8,kMeshCoP,true);
      local_1d0 = local_1a8._0_4_;
      std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_1a0);
      tVar1 = local_1d0;
      if (local_1a0._M_p != local_198 + 8) {
        operator_delete(local_1a0._M_p);
      }
      if (tVar1 != none_type) goto LAB_00164843;
    }
    std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
    function<ot::commissioner::CommissionerImpl::CommandMigrate(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&,std::__cxx11::string_const&)::__1&,void>
              ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)> *)
               local_128._M_pod_data,(anon_class_32_1_d0c21527 *)&local_108);
    ProxyClient::SendRequest
              (&this->mProxyClient,&local_b8,(ResponseHandler *)&local_128,&local_148,0xf0bf);
    if (local_118 != (code *)0x0) {
      (*local_118)(&local_128,&local_128,__destroy_functor);
    }
    local_1a8 = (undefined1  [8])local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"mgmt","");
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_168;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_1f8,(v10 *)"sent MGMT_NET_MIGRATE.req",(string_view)ZEXT816(0x19),
               args);
    Log(kDebug,(string *)local_1a8,(string *)local_1f8);
    if (local_1f8 != (undefined1  [8])local_1e8) {
      operator_delete((void *)local_1f8);
    }
    local_168._M_dataplus._M_p = (pointer)local_1a8;
    if (local_1a8 == (undefined1  [8])local_198) goto LAB_00164843;
  }
  operator_delete(local_168._M_dataplus._M_p);
LAB_00164843:
  if (local_1d0 != none_type) {
    local_e8._0_4_ = local_1d0;
    local_e0._M_p = local_d0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_e0,local_1c8,local_1c8 + local_1c0);
    if ((aHandler->super__Function_base)._M_manager == (_Manager_type)0x0) {
      uVar5 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar5);
    }
    (*aHandler->_M_invoker)((_Any_data *)aHandler,(Error *)local_e8);
    if (local_e0._M_p != local_d0) {
      operator_delete(local_e0._M_p);
    }
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.mRequestUri._M_dataplus._M_p != &local_b8.mRequestUri.field_2) {
    operator_delete(local_b8.mRequestUri._M_dataplus._M_p);
  }
  if (local_b8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.mPayload.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  ::~_Rb_tree(&local_b8.mOptions._M_t);
  if (local_148.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.mBytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  return;
}

Assistant:

void CommissionerImpl::CommandMigrate(ErrorHandler       aHandler,
                                      const std::string &aDstAddr,
                                      const std::string &aDstNetworkName)
{
    Error         error;
    Address       dstAddr;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        aHandler(HandleStateResponse(aResponse, aError, /* aStateTlvIsMandatory */ false));
    };

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    VerifyOrExit(IsCcmMode(), error = ERROR_INVALID_STATE("Migrating a Device is only valid in CCM Mode"));

    SuccessOrExit(error = dstAddr.Set(aDstAddr));
    VerifyOrExit(aDstNetworkName.size() <= kMaxNetworkNameLength,
                 error =
                     ERROR_INVALID_ARGS("Network Name length={} > {}", aDstNetworkName.size(), kMaxNetworkNameLength));

    SuccessOrExit(error = request.SetUriPath(uri::kMgmtNetMigrate));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCommissionerSessionId, GetSessionId()}));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kNetworkName, aDstNetworkName}));

    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }

    mProxyClient.SendRequest(request, onResponse, dstAddr, kDefaultMmPort);

    LOG_DEBUG(LOG_REGION_MGMT, "sent MGMT_NET_MIGRATE.req");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(error);
    }
}